

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

char duckdb::Cast::Operation<unsigned_int,signed_char>(uint input)

{
  bool bVar1;
  undefined1 auVar2 [12];
  char result;
  char local_39;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_int,signed_char>(input,&local_39,false);
  if (bVar1) {
    return local_39;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_int,signed_char>(&local_38,(duckdb *)(ulong)input,auVar2._8_4_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_38);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}